

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O3

bool __thiscall QToolBarPrivate::mousePressEvent(QToolBarPrivate *this,QMouseEvent *event)

{
  QWidget *this_00;
  bool bVar1;
  char cVar2;
  bool bVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  QStyleOptionToolBar opt;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_88);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,(QStyleOptionToolBar *)local_88);
  pQVar4 = QWidget::style(this_00);
  local_98 = (**(code **)(*(long *)pQVar4 + 0xc0))
                       (pQVar4,0x34,(QStyleOptionToolBar *)local_88,this_00);
  auVar7 = QEventPoint::position();
  dVar6 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_;
  bVar3 = 2147483647.0 < dVar6;
  if (dVar6 <= -2147483648.0) {
    dVar6 = -2147483648.0;
  }
  dVar5 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_;
  bVar1 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_a0 = CONCAT44((int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar1 & (ulong)dVar5),
                      (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar3 & (ulong)dVar6));
  cVar2 = QRect::contains((QPoint *)local_98,SUB81(&local_a0,0));
  if ((cVar2 != '\0') && (*(int *)(event + 0x40) == 1)) {
    bVar3 = QToolBarLayout::movable(this->layout);
    if (bVar3) {
      auVar7 = QEventPoint::position();
      dVar6 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_
      ;
      bVar3 = 2147483647.0 < dVar6;
      if (dVar6 <= -2147483648.0) {
        dVar6 = -2147483648.0;
      }
      local_98._0_4_ =
           (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar6);
      dVar6 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_
      ;
      bVar3 = 2147483647.0 < dVar6;
      if (dVar6 <= -2147483648.0) {
        dVar6 = -2147483648.0;
      }
      local_98._4_4_ =
           (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar6);
      initDrag(this,(QPoint *)local_98);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolBarPrivate::mousePressEvent(QMouseEvent *event)
{
    Q_Q(QToolBar);
    QStyleOptionToolBar opt;
    q->initStyleOption(&opt);
    if (q->style()->subElementRect(QStyle::SE_ToolBarHandle, &opt, q).contains(event->position().toPoint()) == false) {
#ifdef Q_OS_MACOS
        // When using the unified toolbar on OS X, the user can click and
        // drag between toolbar contents to move the window. Make this work by
        // implementing the standard mouse-dragging code and then call
        // window->move() in mouseMoveEvent below.
        if (QMainWindow *mainWindow = qobject_cast<QMainWindow *>(parent)) {
            if (mainWindow->toolBarArea(q) == Qt::TopToolBarArea
                    && mainWindow->unifiedTitleAndToolBarOnMac()
                    && q->childAt(event->pos()) == 0) {
                macWindowDragging = true;
                macWindowDragPressPosition = event->pos();
                return true;
            }
        }
#endif
        return false;
    }

    if (event->button() != Qt::LeftButton)
        return true;

    if (!layout->movable())
        return true;

    initDrag(event->position().toPoint());
    return true;
}